

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void closeCursorsInFrame(Vdbe *p)

{
  VdbeCursor *in_RDI;
  VdbeCursor *pC;
  int i;
  int local_c;
  
  for (local_c = 0; local_c < *(int *)&in_RDI->uc; local_c = local_c + 1) {
    if (*(long *)(*(long *)(in_RDI + 1) + (long)local_c * 8) != 0) {
      sqlite3VdbeFreeCursorNN((Vdbe *)pC,in_RDI);
      *(undefined8 *)(*(long *)(in_RDI + 1) + (long)local_c * 8) = 0;
    }
  }
  return;
}

Assistant:

static void closeCursorsInFrame(Vdbe *p){
  int i;
  for(i=0; i<p->nCursor; i++){
    VdbeCursor *pC = p->apCsr[i];
    if( pC ){
      sqlite3VdbeFreeCursorNN(p, pC);
      p->apCsr[i] = 0;
    }
  }
}